

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O2

int jpc_crg_dumpparms(jpc_ms_t *ms,FILE *out)

{
  uint uVar1;
  jpc_crgcomp_t *pjVar2;
  
  pjVar2 = (ms->parms).crg.comps;
  for (uVar1 = 0; (int)uVar1 < (ms->parms).soc; uVar1 = uVar1 + 1) {
    fprintf((FILE *)out,"hoff[%d] = %lu; voff[%d] = %lu\n",(ulong)uVar1,pjVar2->hoff,(ulong)uVar1,
            pjVar2->voff);
    pjVar2 = pjVar2 + 1;
  }
  return 0;
}

Assistant:

static int jpc_crg_dumpparms(jpc_ms_t *ms, FILE *out)
{
	jpc_crg_t *crg = &ms->parms.crg;
	int compno;
	jpc_crgcomp_t *comp;
	for (compno = 0, comp = crg->comps; compno < crg->numcomps; ++compno,
	  ++comp) {
		fprintf(out, "hoff[%d] = %"PRIuFAST16"; voff[%d] = %"PRIuFAST16"\n",
		  compno, comp->hoff, compno, comp->voff);
	}
	return 0;
}